

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_cbc.cc
# Opt level: O3

void EVP_tls_cbc_copy_mac(uint8_t *out,size_t md_size,uint8_t *in,size_t in_len,size_t orig_len)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  byte bVar6;
  size_t i_1;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  size_t i;
  ulong uVar10;
  byte *__s;
  ulong uVar11;
  uint8_t rotated_mac1 [64];
  uint8_t rotated_mac2 [64];
  byte local_b8 [64];
  byte local_78 [72];
  
  if (orig_len < in_len) {
    __assert_fail("constant_time_declassify_int(orig_len >= in_len)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/tls_cbc.cc"
                  ,0x56,
                  "void EVP_tls_cbc_copy_mac(uint8_t *, size_t, const uint8_t *, size_t, size_t)");
  }
  if (in_len < md_size) {
    __assert_fail("constant_time_declassify_int(in_len >= md_size)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/tls_cbc.cc"
                  ,0x57,
                  "void EVP_tls_cbc_copy_mac(uint8_t *, size_t, const uint8_t *, size_t, size_t)");
  }
  if (0x40 < md_size) {
    __assert_fail("md_size <= EVP_MAX_MD_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/tls_cbc.cc"
                  ,0x58,
                  "void EVP_tls_cbc_copy_mac(uint8_t *, size_t, const uint8_t *, size_t, size_t)");
  }
  if (md_size != 0) {
    uVar3 = md_size | 0x100;
    uVar11 = 0;
    uVar10 = orig_len - uVar3;
    if (orig_len < uVar3) {
      uVar10 = uVar11;
    }
    __s = local_b8;
    memset(__s,0,md_size);
    if (uVar10 < orig_len) {
      if (orig_len < uVar3) {
        uVar3 = orig_len;
      }
      uVar11 = 0;
      uVar2 = 0;
      uVar4 = 0;
      do {
        sVar8 = 0;
        if (md_size <= uVar2) {
          sVar8 = md_size;
        }
        uVar7 = uVar10 ^ in_len - md_size;
        uVar7 = (long)(uVar7 - 1 & ~uVar7) >> 0x3f;
        uVar4 = uVar4 | uVar7;
        bVar6 = (byte)(uVar10 >> 0x38);
        local_b8[uVar2 - sVar8] =
             local_b8[uVar2 - sVar8] |
             (char)(((byte)(uVar10 - in_len >> 0x38) ^ bVar6 | bVar6 ^ (byte)(in_len >> 0x38)) ^
                   bVar6) >> 7 & (byte)uVar4 & in[uVar10];
        uVar11 = uVar11 | uVar7 & uVar2 - sVar8;
        uVar10 = uVar10 + 1;
        uVar2 = (uVar2 - sVar8) + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    if (md_size != 1) {
      uVar3 = 1;
      pbVar1 = local_78;
      pbVar5 = local_b8;
      do {
        __s = pbVar1;
        bVar6 = ((byte)uVar11 & 1) - 1;
        sVar8 = 0;
        uVar10 = uVar3;
        do {
          sVar9 = 0;
          if (md_size <= uVar10) {
            sVar9 = md_size;
          }
          __s[sVar8] = pbVar5[uVar10 - sVar9] & ~bVar6 | pbVar5[sVar8] & bVar6;
          sVar8 = sVar8 + 1;
          uVar10 = (uVar10 - sVar9) + 1;
        } while (md_size != sVar8);
        uVar3 = uVar3 * 2;
        uVar11 = uVar11 >> 1;
        pbVar1 = pbVar5;
        pbVar5 = __s;
      } while (uVar3 < md_size);
    }
    memcpy(out,__s,md_size);
    return;
  }
  __assert_fail("md_size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/tls_cbc.cc"
                ,0x59,
                "void EVP_tls_cbc_copy_mac(uint8_t *, size_t, const uint8_t *, size_t, size_t)");
}

Assistant:

void EVP_tls_cbc_copy_mac(uint8_t *out, size_t md_size, const uint8_t *in,
                          size_t in_len, size_t orig_len) {
  uint8_t rotated_mac1[EVP_MAX_MD_SIZE], rotated_mac2[EVP_MAX_MD_SIZE];
  uint8_t *rotated_mac = rotated_mac1;
  uint8_t *rotated_mac_tmp = rotated_mac2;

  // mac_end is the index of |in| just after the end of the MAC.
  size_t mac_end = in_len;
  size_t mac_start = mac_end - md_size;

  declassify_assert(orig_len >= in_len);
  declassify_assert(in_len >= md_size);
  assert(md_size <= EVP_MAX_MD_SIZE);
  assert(md_size > 0);

  // scan_start contains the number of bytes that we can ignore because
  // the MAC's position can only vary by 255 bytes.
  size_t scan_start = 0;
  // This information is public so it's safe to branch based on it.
  if (orig_len > md_size + 255 + 1) {
    scan_start = orig_len - (md_size + 255 + 1);
  }

  size_t rotate_offset = 0;
  uint8_t mac_started = 0;
  OPENSSL_memset(rotated_mac, 0, md_size);
  for (size_t i = scan_start, j = 0; i < orig_len; i++, j++) {
    if (j >= md_size) {
      j -= md_size;
    }
    crypto_word_t is_mac_start = constant_time_eq_w(i, mac_start);
    mac_started |= is_mac_start;
    uint8_t mac_ended = constant_time_ge_8(i, mac_end);
    rotated_mac[j] |= in[i] & mac_started & ~mac_ended;
    // Save the offset that |mac_start| is mapped to.
    rotate_offset |= j & is_mac_start;
  }

  // Now rotate the MAC. We rotate in log(md_size) steps, one for each bit
  // position.
  for (size_t offset = 1; offset < md_size; offset <<= 1, rotate_offset >>= 1) {
    // Rotate by |offset| iff the corresponding bit is set in
    // |rotate_offset|, placing the result in |rotated_mac_tmp|.
    const uint8_t skip_rotate = (rotate_offset & 1) - 1;
    for (size_t i = 0, j = offset; i < md_size; i++, j++) {
      if (j >= md_size) {
        j -= md_size;
      }
      rotated_mac_tmp[i] =
          constant_time_select_8(skip_rotate, rotated_mac[i], rotated_mac[j]);
    }

    // Swap pointers so |rotated_mac| contains the (possibly) rotated value.
    // Note the number of iterations and thus the identity of these pointers is
    // public information.
    uint8_t *tmp = rotated_mac;
    rotated_mac = rotated_mac_tmp;
    rotated_mac_tmp = tmp;
  }

  OPENSSL_memcpy(out, rotated_mac, md_size);
}